

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_scalar_fe_space.h
# Opt level: O0

UniformFEDofHandler * __thiscall
lf::uscalfe::UniformScalarFESpace<double>::InitDofHandler
          (UniformFEDofHandler *__return_storage_ptr__,UniformScalarFESpace<double> *this,
          shared_ptr<const_lf::mesh::Mesh> *mesh_p)

{
  initializer_list<std::pair<const_lf::base::RefEl,_unsigned_int>_> __l;
  bool bVar1;
  RefElType RVar2;
  RefElType RVar3;
  int iVar4;
  size_type sVar5;
  int iVar6;
  uint uVar7;
  runtime_error *prVar8;
  element_type *peVar9;
  element_type *peVar10;
  ostream *poVar11;
  map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  local_2548;
  shared_ptr<const_lf::mesh::Mesh> local_2518;
  allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_> local_2506;
  less<lf::base::RefEl> local_2505;
  RefEl local_2504;
  RefEl local_2503;
  RefEl local_2502;
  RefEl local_2501;
  pair<const_lf::base::RefEl,_unsigned_int> local_2500;
  pair<const_lf::base::RefEl,_unsigned_int> local_24f8;
  pair<const_lf::base::RefEl,_unsigned_int> local_24f0;
  pair<const_lf::base::RefEl,_unsigned_int> local_24e8;
  pair<const_lf::base::RefEl,_unsigned_int> *local_24e0;
  size_type local_24d8;
  undefined1 local_24d0 [8];
  dof_map_t rsf_layout;
  string local_2498;
  allocator<char> local_2471;
  string local_2470;
  allocator<char> local_2449;
  string local_2448;
  string local_2428;
  allocator<char> local_2401;
  string local_2400;
  allocator<char> local_23d9;
  string local_23d8;
  stringstream local_23b8 [8];
  stringstream ss_16;
  ostream local_23a8 [383];
  allocator<char> local_2229;
  string local_2228;
  allocator<char> local_2201;
  string local_2200;
  allocator<char> local_21d9;
  string local_21d8;
  string local_21b8;
  allocator<char> local_2191;
  string local_2190;
  allocator<char> local_2169;
  string local_2168;
  stringstream local_2148 [8];
  stringstream ss_15;
  ostream local_2138 [383];
  allocator<char> local_1fb9;
  string local_1fb8;
  allocator<char> local_1f91;
  string local_1f90;
  allocator<char> local_1f69;
  string local_1f68;
  string local_1f48;
  allocator<char> local_1f21;
  string local_1f20;
  allocator<char> local_1ef9;
  string local_1ef8;
  stringstream local_1ed8 [8];
  stringstream ss_14;
  ostream local_1ec8 [383];
  allocator<char> local_1d49;
  string local_1d48;
  allocator<char> local_1d21;
  string local_1d20;
  allocator<char> local_1cf9;
  string local_1cf8;
  string local_1cd8;
  allocator<char> local_1cb1;
  string local_1cb0;
  allocator<char> local_1c89;
  string local_1c88;
  stringstream local_1c68 [8];
  stringstream ss_13;
  ostream local_1c58 [383];
  allocator<char> local_1ad9;
  string local_1ad8;
  allocator<char> local_1ab1;
  string local_1ab0;
  allocator<char> local_1a89;
  string local_1a88;
  string local_1a68;
  allocator<char> local_1a41;
  string local_1a40;
  allocator<char> local_1a19;
  string local_1a18;
  stringstream local_19f8 [8];
  stringstream ss_12;
  ostream local_19e8 [383];
  allocator<char> local_1869;
  string local_1868;
  allocator<char> local_1841;
  string local_1840;
  allocator<char> local_1819;
  string local_1818;
  string local_17f8;
  allocator<char> local_17d1;
  string local_17d0;
  allocator<char> local_17a9;
  string local_17a8;
  stringstream local_1788 [8];
  stringstream ss_11;
  ostream local_1778 [376];
  string local_1600;
  allocator<char> local_15d9;
  string local_15d8;
  allocator<char> local_15b1;
  string local_15b0;
  stringstream local_1590 [8];
  stringstream ss_10;
  ostream local_1580 [376];
  string local_1408;
  allocator<char> local_13e1;
  string local_13e0;
  allocator<char> local_13b9;
  string local_13b8;
  stringstream local_1398 [8];
  stringstream ss_9;
  ostream local_1388 [382];
  RefEl local_120a;
  RefEl local_1209;
  string local_1208;
  allocator<char> local_11e1;
  string local_11e0;
  allocator<char> local_11b9;
  string local_11b8;
  stringstream local_1198 [8];
  stringstream ss_8;
  ostream local_1188 [376];
  string local_1010;
  allocator<char> local_fe9;
  string local_fe8;
  allocator<char> local_fc1;
  string local_fc0;
  stringstream local_fa0 [8];
  stringstream ss_7;
  ostream local_f90 [382];
  RefEl local_e12;
  RefEl local_e11;
  string local_e10;
  allocator<char> local_de9;
  string local_de8;
  allocator<char> local_dc1;
  string local_dc0;
  stringstream local_da0 [8];
  stringstream ss_6;
  ostream local_d90 [376];
  string local_c18;
  allocator<char> local_bf1;
  string local_bf0;
  allocator<char> local_bc9;
  string local_bc8;
  stringstream local_ba8 [8];
  stringstream ss_5;
  ostream local_b98 [382];
  RefEl local_a1a;
  RefEl local_a19;
  string local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  stringstream local_9a8 [8];
  stringstream ss_4;
  ostream local_998 [383];
  RefElType local_819;
  string local_818;
  allocator<char> local_7f1;
  string local_7f0;
  allocator<char> local_7c9;
  string local_7c8;
  stringstream local_7a8 [8];
  stringstream ss_3;
  ostream local_798 [383];
  RefElType local_619;
  string local_618;
  allocator<char> local_5f1;
  string local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  stringstream local_5a8 [8];
  stringstream ss_2;
  ostream local_598 [376];
  string local_420;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  stringstream local_3b0 [8];
  stringstream ss_1;
  ostream local_3a0 [376];
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  shared_ptr<const_lf::mesh::Mesh> *local_20;
  shared_ptr<const_lf::mesh::Mesh> *mesh_p_local;
  UniformScalarFESpace<double> *this_local;
  
  local_20 = mesh_p;
  mesh_p_local = (shared_ptr<const_lf::mesh::Mesh> *)this;
  this_local = (UniformScalarFESpace<double> *)__return_storage_ptr__;
  bVar1 = std::operator==(mesh_p,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,"Missing mesh!");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"mesh_p != nullptr",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0xf4,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"this code should not be reached");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::operator==(&this->rfs_quad_p_,(nullptr_t)0x0);
  if ((((bVar1 ^ 0xffU) & 1) == 0) &&
     (bVar1 = std::operator==(&this->rfs_tria_p_,(nullptr_t)0x0), ((bVar1 ^ 0xffU) & 1) == 0)) {
    std::__cxx11::stringstream::stringstream(local_3b0);
    std::operator<<(local_3a0,"Missing FE specification for cells");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,"(rfs_quad_p_ != nullptr) || (rfs_tria_p_ != nullptr)",
               &local_3d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
               ,&local_3f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_3d0,&local_3f8,0xf6,&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator(&local_3f9);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"this code should not be reached");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar9 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)mesh_p);
  iVar4 = (**peVar9->_vptr_Mesh)();
  if (iVar4 != 2) {
    std::__cxx11::stringstream::stringstream(local_5a8);
    std::operator<<(local_598,"Only for 2D meshes");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c8,"(mesh_p->DimMesh() == 2)",&local_5c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
               ,&local_5f1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_5c8,&local_5f0,0xf7,&local_618);
    std::__cxx11::string::~string((string *)&local_618);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::allocator<char>::~allocator(&local_5f1);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::~allocator(&local_5c9);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"this code should not be reached");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar9 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)mesh_p);
  local_619 = (RefElType)lf::base::RefEl::kTria();
  iVar4 = (*peVar9->_vptr_Mesh[4])(peVar9,(ulong)local_619);
  if ((iVar4 != 0) &&
     (bVar1 = std::operator==(&this->rfs_tria_p_,(nullptr_t)0x0), ((bVar1 ^ 0xffU) & 1) == 0)) {
    std::__cxx11::stringstream::stringstream(local_7a8);
    std::operator<<(local_798,"Missing FE specification for triangles though mesh contains some");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7c8,
               "(mesh_p->NumEntities(lf::base::RefEl::kTria()) == 0) || (rfs_tria_p_ != nullptr)",
               &local_7c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
               ,&local_7f1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_7c8,&local_7f0,0xfd,&local_818);
    std::__cxx11::string::~string((string *)&local_818);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::allocator<char>::~allocator(&local_7f1);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::allocator<char>::~allocator(&local_7c9);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"this code should not be reached");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar9 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)mesh_p);
  local_819 = (RefElType)lf::base::RefEl::kQuad();
  iVar4 = (*peVar9->_vptr_Mesh[4])(peVar9,(ulong)local_819);
  if ((iVar4 != 0) &&
     (bVar1 = std::operator==(&this->rfs_quad_p_,(nullptr_t)0x0), ((bVar1 ^ 0xffU) & 1) == 0)) {
    std::__cxx11::stringstream::stringstream(local_9a8);
    std::operator<<(local_998,"Missing FE specification for quads though mesh contains some");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9c8,
               "(mesh_p->NumEntities(lf::base::RefEl::kQuad()) == 0) || (rfs_quad_p_ != nullptr)",
               &local_9c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
               ,&local_9f1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_9c8,&local_9f0,0x100,&local_a18);
    std::__cxx11::string::~string((string *)&local_a18);
    std::__cxx11::string::~string((string *)&local_9f0);
    std::allocator<char>::~allocator(&local_9f1);
    std::__cxx11::string::~string((string *)&local_9c8);
    std::allocator<char>::~allocator(&local_9c9);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"this code should not be reached");
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::operator==(&this->rfs_tria_p_,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_tria_p_);
    iVar4 = (*peVar10->_vptr_ScalarReferenceFiniteElement[2])();
    local_a19.type_ = (RefElType)iVar4;
    RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_a19);
    local_a1a = lf::base::RefEl::kTria();
    RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_a1a);
    if (RVar2 != RVar3) {
      std::__cxx11::stringstream::stringstream(local_ba8);
      std::operator<<(local_b98,"Wrong type for triangle!");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bc8,"(*rfs_tria_p_).RefEl() == lf::base::RefEl::kTria()",
                 &local_bc9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bf0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_bf1);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_bc8,&local_bf0,0x108,&local_c18);
      std::__cxx11::string::~string((string *)&local_c18);
      std::__cxx11::string::~string((string *)&local_bf0);
      std::allocator<char>::~allocator(&local_bf1);
      std::__cxx11::string::~string((string *)&local_bc8);
      std::allocator<char>::~allocator(&local_bc9);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"this code should not be reached");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_tria_p_);
    uVar7 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,2);
    if (1 < uVar7) {
      std::__cxx11::stringstream::stringstream(local_da0);
      std::operator<<(local_d90,"At most one shape function can be assigned to each vertex");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_dc0,"(*rfs_tria_p_).NumRefShapeFunctions(2) <= 1",&local_dc1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_de8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_de9);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_dc0,&local_de8,0x10a,&local_e10);
      std::__cxx11::string::~string((string *)&local_e10);
      std::__cxx11::string::~string((string *)&local_de8);
      std::allocator<char>::~allocator(&local_de9);
      std::__cxx11::string::~string((string *)&local_dc0);
      std::allocator<char>::~allocator(&local_dc1);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"this code should not be reached");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_tria_p_);
    sVar5 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,2);
    this->num_rsf_node_ = sVar5;
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_tria_p_);
    sVar5 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,1);
    this->num_rsf_edge_ = sVar5;
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_tria_p_);
    sVar5 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,0);
    this->num_rsf_tria_ = sVar5;
  }
  bVar1 = std::operator==(&this->rfs_quad_p_,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_quad_p_);
    iVar4 = (*peVar10->_vptr_ScalarReferenceFiniteElement[2])();
    local_e11.type_ = (RefElType)iVar4;
    RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_e11);
    local_e12 = lf::base::RefEl::kQuad();
    RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_e12);
    if (RVar2 != RVar3) {
      std::__cxx11::stringstream::stringstream(local_fa0);
      std::operator<<(local_f90,"Wrong type for quad!");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_fc0,"(*rfs_quad_p_).RefEl() == lf::base::RefEl::kQuad()",
                 &local_fc1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_fe8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_fe9);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_fc0,&local_fe8,0x113,&local_1010);
      std::__cxx11::string::~string((string *)&local_1010);
      std::__cxx11::string::~string((string *)&local_fe8);
      std::allocator<char>::~allocator(&local_fe9);
      std::__cxx11::string::~string((string *)&local_fc0);
      std::allocator<char>::~allocator(&local_fc1);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"this code should not be reached");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_quad_p_);
    uVar7 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,2);
    if (1 < uVar7) {
      std::__cxx11::stringstream::stringstream(local_1198);
      std::operator<<(local_1188,"At most one shape function can be assigned to each vertex");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_11b8,"(*rfs_quad_p_).NumRefShapeFunctions(2) <= 1",&local_11b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_11e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_11e1);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_11b8,&local_11e0,0x115,&local_1208);
      std::__cxx11::string::~string((string *)&local_1208);
      std::__cxx11::string::~string((string *)&local_11e0);
      std::allocator<char>::~allocator(&local_11e1);
      std::__cxx11::string::~string((string *)&local_11b8);
      std::allocator<char>::~allocator(&local_11b9);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"this code should not be reached");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_quad_p_);
    sVar5 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,2);
    this->num_rsf_node_ = sVar5;
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_quad_p_);
    sVar5 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,1);
    this->num_rsf_edge_ = sVar5;
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_quad_p_);
    sVar5 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,0);
    this->num_rsf_quad_ = sVar5;
  }
  bVar1 = std::operator==(&this->rfs_edge_p_,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_edge_p_);
    iVar4 = (*peVar10->_vptr_ScalarReferenceFiniteElement[2])();
    local_1209.type_ = (RefElType)iVar4;
    RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_1209);
    local_120a = lf::base::RefEl::kSegment();
    RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_120a);
    if (RVar2 != RVar3) {
      std::__cxx11::stringstream::stringstream(local_1398);
      std::operator<<(local_1388,"Wrong type for edge!");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13b8,"(*rfs_edge_p_).RefEl() == lf::base::RefEl::kSegment()",
                 &local_13b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_13e1);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_13b8,&local_13e0,0x11d,&local_1408);
      std::__cxx11::string::~string((string *)&local_1408);
      std::__cxx11::string::~string((string *)&local_13e0);
      std::allocator<char>::~allocator(&local_13e1);
      std::__cxx11::string::~string((string *)&local_13b8);
      std::allocator<char>::~allocator(&local_13b9);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"this code should not be reached");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_edge_p_);
    uVar7 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,1);
    if (1 < uVar7) {
      std::__cxx11::stringstream::stringstream(local_1590);
      std::operator<<(local_1580,"At most one shape function can be assigned to each vertex");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_15b0,"(*rfs_edge_p_).NumRefShapeFunctions(1) <= 1",&local_15b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_15d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_15d9);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_15b0,&local_15d8,0x11f,&local_1600);
      std::__cxx11::string::~string((string *)&local_1600);
      std::__cxx11::string::~string((string *)&local_15d8);
      std::allocator<char>::~allocator(&local_15d9);
      std::__cxx11::string::~string((string *)&local_15b0);
      std::allocator<char>::~allocator(&local_15b1);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"this code should not be reached");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_edge_p_);
    sVar5 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,1);
    this->num_rsf_node_ = sVar5;
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_edge_p_);
    sVar5 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,0);
    this->num_rsf_edge_ = sVar5;
  }
  bVar1 = std::operator==(&this->rfs_tria_p_,(nullptr_t)0x0);
  if ((((bVar1 ^ 0xffU) & 1) != 0) &&
     (bVar1 = std::operator==(&this->rfs_quad_p_,(nullptr_t)0x0), ((bVar1 ^ 0xffU) & 1) != 0)) {
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_tria_p_);
    iVar4 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,2);
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_quad_p_);
    iVar6 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,2);
    if (iVar4 != iVar6) {
      std::__cxx11::stringstream::stringstream(local_1788);
      poVar11 = std::operator<<(local_1778,"#RSF mismatch on nodes ");
      peVar10 = std::
                __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->rfs_tria_p_);
      uVar7 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,2);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar7);
      poVar11 = std::operator<<(poVar11," <-> ");
      peVar10 = std::
                __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->rfs_quad_p_);
      uVar7 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,2);
      std::ostream::operator<<(poVar11,uVar7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_17a8,
                 "((*rfs_tria_p_).NumRefShapeFunctions(2) == (*rfs_quad_p_).NumRefShapeFunctions(2))"
                 ,&local_17a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_17d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_17d1);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_17a8,&local_17d0,300,&local_17f8);
      std::__cxx11::string::~string((string *)&local_17f8);
      std::__cxx11::string::~string((string *)&local_17d0);
      std::allocator<char>::~allocator(&local_17d1);
      std::__cxx11::string::~string((string *)&local_17a8);
      std::allocator<char>::~allocator(&local_17a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1818,"false",&local_1819);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1840,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_1841);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1868,"",&local_1869);
      lf::base::AssertionFailed(&local_1818,&local_1840,300,&local_1868);
      std::__cxx11::string::~string((string *)&local_1868);
      std::allocator<char>::~allocator(&local_1869);
      std::__cxx11::string::~string((string *)&local_1840);
      std::allocator<char>::~allocator(&local_1841);
      std::__cxx11::string::~string((string *)&local_1818);
      std::allocator<char>::~allocator(&local_1819);
      abort();
    }
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_tria_p_);
    iVar4 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,1);
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_quad_p_);
    iVar6 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,1);
    if (iVar4 != iVar6) {
      std::__cxx11::stringstream::stringstream(local_19f8);
      poVar11 = std::operator<<(local_19e8,"#RSF mismatch on edges ");
      peVar10 = std::
                __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->rfs_tria_p_);
      uVar7 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,1);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar7);
      poVar11 = std::operator<<(poVar11," <-> ");
      peVar10 = std::
                __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->rfs_quad_p_);
      uVar7 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,1);
      std::ostream::operator<<(poVar11,uVar7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a18,
                 "((*rfs_tria_p_).NumRefShapeFunctions(1) == (*rfs_quad_p_).NumRefShapeFunctions(1))"
                 ,&local_1a19);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a40,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_1a41);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_1a18,&local_1a40,0x131,&local_1a68);
      std::__cxx11::string::~string((string *)&local_1a68);
      std::__cxx11::string::~string((string *)&local_1a40);
      std::allocator<char>::~allocator(&local_1a41);
      std::__cxx11::string::~string((string *)&local_1a18);
      std::allocator<char>::~allocator(&local_1a19);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a88,"false",&local_1a89);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1ab0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_1ab1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ad8,"",&local_1ad9);
      lf::base::AssertionFailed(&local_1a88,&local_1ab0,0x131,&local_1ad8);
      std::__cxx11::string::~string((string *)&local_1ad8);
      std::allocator<char>::~allocator(&local_1ad9);
      std::__cxx11::string::~string((string *)&local_1ab0);
      std::allocator<char>::~allocator(&local_1ab1);
      std::__cxx11::string::~string((string *)&local_1a88);
      std::allocator<char>::~allocator(&local_1a89);
      abort();
    }
  }
  bVar1 = std::operator==(&this->rfs_tria_p_,(nullptr_t)0x0);
  if ((((bVar1 ^ 0xffU) & 1) != 0) &&
     (bVar1 = std::operator==(&this->rfs_edge_p_,(nullptr_t)0x0), ((bVar1 ^ 0xffU) & 1) != 0)) {
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_tria_p_);
    iVar4 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,2);
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_edge_p_);
    iVar6 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,1);
    if (iVar4 != iVar6) {
      std::__cxx11::stringstream::stringstream(local_1c68);
      poVar11 = std::operator<<(local_1c58,"#RSF mismatch on nodes ");
      peVar10 = std::
                __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->rfs_tria_p_);
      uVar7 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,2);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar7);
      poVar11 = std::operator<<(poVar11," <-> ");
      peVar10 = std::
                __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->rfs_edge_p_);
      uVar7 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,1);
      std::ostream::operator<<(poVar11,uVar7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c88,
                 "((*rfs_tria_p_).NumRefShapeFunctions(2) == (*rfs_edge_p_).NumRefShapeFunctions(1))"
                 ,&local_1c89);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1cb0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_1cb1);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_1c88,&local_1cb0,0x138,&local_1cd8);
      std::__cxx11::string::~string((string *)&local_1cd8);
      std::__cxx11::string::~string((string *)&local_1cb0);
      std::allocator<char>::~allocator(&local_1cb1);
      std::__cxx11::string::~string((string *)&local_1c88);
      std::allocator<char>::~allocator(&local_1c89);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1cf8,"false",&local_1cf9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d20,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_1d21);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d48,"",&local_1d49);
      lf::base::AssertionFailed(&local_1cf8,&local_1d20,0x138,&local_1d48);
      std::__cxx11::string::~string((string *)&local_1d48);
      std::allocator<char>::~allocator(&local_1d49);
      std::__cxx11::string::~string((string *)&local_1d20);
      std::allocator<char>::~allocator(&local_1d21);
      std::__cxx11::string::~string((string *)&local_1cf8);
      std::allocator<char>::~allocator(&local_1cf9);
      abort();
    }
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_tria_p_);
    iVar4 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,1);
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_edge_p_);
    iVar6 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,0);
    if (iVar4 != iVar6) {
      std::__cxx11::stringstream::stringstream(local_1ed8);
      poVar11 = std::operator<<(local_1ec8,"#RSF mismatch on edges ");
      peVar10 = std::
                __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->rfs_tria_p_);
      uVar7 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,1);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar7);
      poVar11 = std::operator<<(poVar11," <-> ");
      peVar10 = std::
                __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->rfs_edge_p_);
      uVar7 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,0);
      std::ostream::operator<<(poVar11,uVar7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1ef8,
                 "((*rfs_tria_p_).NumRefShapeFunctions(1) == (*rfs_edge_p_).NumRefShapeFunctions(0))"
                 ,&local_1ef9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f20,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_1f21);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_1ef8,&local_1f20,0x13d,&local_1f48);
      std::__cxx11::string::~string((string *)&local_1f48);
      std::__cxx11::string::~string((string *)&local_1f20);
      std::allocator<char>::~allocator(&local_1f21);
      std::__cxx11::string::~string((string *)&local_1ef8);
      std::allocator<char>::~allocator(&local_1ef9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f68,"false",&local_1f69);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f90,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_1f91);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1fb8,"",&local_1fb9);
      lf::base::AssertionFailed(&local_1f68,&local_1f90,0x13d,&local_1fb8);
      std::__cxx11::string::~string((string *)&local_1fb8);
      std::allocator<char>::~allocator(&local_1fb9);
      std::__cxx11::string::~string((string *)&local_1f90);
      std::allocator<char>::~allocator(&local_1f91);
      std::__cxx11::string::~string((string *)&local_1f68);
      std::allocator<char>::~allocator(&local_1f69);
      abort();
    }
  }
  bVar1 = std::operator==(&this->rfs_quad_p_,(nullptr_t)0x0);
  if ((((bVar1 ^ 0xffU) & 1) != 0) &&
     (bVar1 = std::operator==(&this->rfs_edge_p_,(nullptr_t)0x0), ((bVar1 ^ 0xffU) & 1) != 0)) {
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_quad_p_);
    iVar4 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,2);
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_edge_p_);
    iVar6 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,1);
    if (iVar4 != iVar6) {
      std::__cxx11::stringstream::stringstream(local_2148);
      poVar11 = std::operator<<(local_2138,"#RSF mismatch on edges ");
      peVar10 = std::
                __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->rfs_quad_p_);
      uVar7 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,2);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar7);
      poVar11 = std::operator<<(poVar11," <-> ");
      peVar10 = std::
                __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->rfs_edge_p_);
      uVar7 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,1);
      std::ostream::operator<<(poVar11,uVar7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2168,
                 "((*rfs_quad_p_).NumRefShapeFunctions(2) == (*rfs_edge_p_).NumRefShapeFunctions(1))"
                 ,&local_2169);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2190,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_2191);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_2168,&local_2190,0x144,&local_21b8);
      std::__cxx11::string::~string((string *)&local_21b8);
      std::__cxx11::string::~string((string *)&local_2190);
      std::allocator<char>::~allocator(&local_2191);
      std::__cxx11::string::~string((string *)&local_2168);
      std::allocator<char>::~allocator(&local_2169);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_21d8,"false",&local_21d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2200,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_2201);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2228,"",&local_2229);
      lf::base::AssertionFailed(&local_21d8,&local_2200,0x144,&local_2228);
      std::__cxx11::string::~string((string *)&local_2228);
      std::allocator<char>::~allocator(&local_2229);
      std::__cxx11::string::~string((string *)&local_2200);
      std::allocator<char>::~allocator(&local_2201);
      std::__cxx11::string::~string((string *)&local_21d8);
      std::allocator<char>::~allocator(&local_21d9);
      abort();
    }
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_quad_p_);
    iVar4 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,1);
    peVar10 = std::
              __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->rfs_edge_p_);
    iVar6 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,0);
    if (iVar4 != iVar6) {
      std::__cxx11::stringstream::stringstream(local_23b8);
      poVar11 = std::operator<<(local_23a8,"#RSF mismatch on edges ");
      peVar10 = std::
                __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->rfs_quad_p_);
      uVar7 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,1);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar7);
      poVar11 = std::operator<<(poVar11," <-> ");
      peVar10 = std::
                __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->rfs_edge_p_);
      uVar7 = (*peVar10->_vptr_ScalarReferenceFiniteElement[5])(peVar10,0);
      std::ostream::operator<<(poVar11,uVar7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_23d8,
                 "((*rfs_quad_p_).NumRefShapeFunctions(1) == (*rfs_edge_p_).NumRefShapeFunctions(0))"
                 ,&local_23d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2400,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_2401);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_23d8,&local_2400,0x149,&local_2428);
      std::__cxx11::string::~string((string *)&local_2428);
      std::__cxx11::string::~string((string *)&local_2400);
      std::allocator<char>::~allocator(&local_2401);
      std::__cxx11::string::~string((string *)&local_23d8);
      std::allocator<char>::~allocator(&local_23d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2448,"false",&local_2449);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2470,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_2471);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2498,"",
                 (allocator<char> *)
                 ((long)&rsf_layout._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      lf::base::AssertionFailed(&local_2448,&local_2470,0x149,&local_2498);
      std::__cxx11::string::~string((string *)&local_2498);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&rsf_layout._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      std::__cxx11::string::~string((string *)&local_2470);
      std::allocator<char>::~allocator(&local_2471);
      std::__cxx11::string::~string((string *)&local_2448);
      std::allocator<char>::~allocator(&local_2449);
      abort();
    }
  }
  local_2501 = lf::base::RefEl::kPoint();
  std::pair<const_lf::base::RefEl,_unsigned_int>::pair<lf::base::RefEl,_unsigned_int_&,_true>
            (&local_2500,&local_2501,&this->num_rsf_node_);
  local_2502 = lf::base::RefEl::kSegment();
  std::pair<const_lf::base::RefEl,_unsigned_int>::pair<lf::base::RefEl,_unsigned_int_&,_true>
            (&local_24f8,&local_2502,&this->num_rsf_edge_);
  local_2503 = lf::base::RefEl::kTria();
  std::pair<const_lf::base::RefEl,_unsigned_int>::pair<lf::base::RefEl,_unsigned_int_&,_true>
            (&local_24f0,&local_2503,&this->num_rsf_tria_);
  local_2504 = lf::base::RefEl::kQuad();
  std::pair<const_lf::base::RefEl,_unsigned_int>::pair<lf::base::RefEl,_unsigned_int_&,_true>
            (&local_24e8,&local_2504,&this->num_rsf_quad_);
  local_24d8 = 4;
  local_24e0 = &local_2500;
  std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>::allocator(&local_2506);
  __l._M_len = local_24d8;
  __l._M_array = local_24e0;
  std::
  map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  ::map((map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
         *)local_24d0,__l,&local_2505,&local_2506);
  std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>::~allocator(&local_2506);
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr(&local_2518,mesh_p);
  std::
  map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  ::map(&local_2548,
        (map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
         *)local_24d0);
  assemble::UniformFEDofHandler::UniformFEDofHandler
            (__return_storage_ptr__,&local_2518,&local_2548,true);
  std::
  map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  ::~map(&local_2548);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_2518);
  std::
  map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  ::~map((map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
          *)local_24d0);
  return __return_storage_ptr__;
}

Assistant:

assemble::UniformFEDofHandler UniformScalarFESpace<SCALAR>::InitDofHandler(
    std::shared_ptr<const lf::mesh::Mesh> mesh_p) {
  // Check validity and consistency of mesh pointer
  LF_VERIFY_MSG(mesh_p != nullptr, "Missing mesh!");
  LF_VERIFY_MSG((rfs_quad_p_ != nullptr) || (rfs_tria_p_ != nullptr),
                "Missing FE specification for cells");
  LF_VERIFY_MSG((mesh_p->DimMesh() == 2), "Only for 2D meshes");

  // Check whether all required finite element specifications are provided
  LF_VERIFY_MSG(
      (mesh_p->NumEntities(lf::base::RefEl::kTria()) == 0) ||
          (rfs_tria_p_ != nullptr),
      "Missing FE specification for triangles though mesh contains some");
  LF_VERIFY_MSG((mesh_p->NumEntities(lf::base::RefEl::kQuad()) == 0) ||
                    (rfs_quad_p_ != nullptr),
                "Missing FE specification for quads though mesh contains some");

  // Compatibility checks and initialization of numbers of shape functions
  // In particular only a single shape function may be associated to a node
  // in the case of a SCALAR finite element space
  if (rfs_tria_p_ != nullptr) {
    // Probe local shape functions on a triangle
    LF_VERIFY_MSG((*rfs_tria_p_).RefEl() == lf::base::RefEl::kTria(),
                  "Wrong type for triangle!");
    LF_VERIFY_MSG((*rfs_tria_p_).NumRefShapeFunctions(2) <= 1,
                  "At most one shape function can be assigned to each vertex");
    // Initialize numbers of shape functions associated to entities
    num_rsf_node_ = (*rfs_tria_p_).NumRefShapeFunctions(2);
    num_rsf_edge_ = (*rfs_tria_p_).NumRefShapeFunctions(1);
    num_rsf_tria_ = (*rfs_tria_p_).NumRefShapeFunctions(0);
  }
  if (rfs_quad_p_ != nullptr) {
    // Probe local shape functions for QUADs
    LF_VERIFY_MSG((*rfs_quad_p_).RefEl() == lf::base::RefEl::kQuad(),
                  "Wrong type for quad!");
    LF_VERIFY_MSG((*rfs_quad_p_).NumRefShapeFunctions(2) <= 1,
                  "At most one shape function can be assigned to each vertex");
    // Initialize numbers of shape functions associated to entities
    num_rsf_node_ = (*rfs_quad_p_).NumRefShapeFunctions(2);
    num_rsf_edge_ = (*rfs_quad_p_).NumRefShapeFunctions(1);
    num_rsf_quad_ = (*rfs_quad_p_).NumRefShapeFunctions(0);
  }
  if (rfs_edge_p_ != nullptr) {
    LF_VERIFY_MSG((*rfs_edge_p_).RefEl() == lf::base::RefEl::kSegment(),
                  "Wrong type for edge!");
    LF_VERIFY_MSG((*rfs_edge_p_).NumRefShapeFunctions(1) <= 1,
                  "At most one shape function can be assigned to each vertex");
    num_rsf_node_ = (*rfs_edge_p_).NumRefShapeFunctions(1);
    num_rsf_edge_ = (*rfs_edge_p_).NumRefShapeFunctions(0);
  }

  // Compatibility check for numbers of local shape functions associated with
  // edges. Those must be the same for all reference shape function descriptions
  // passed to the finite element space.
  if ((rfs_tria_p_ != nullptr) && (rfs_quad_p_ != nullptr)) {
    LF_ASSERT_MSG(((*rfs_tria_p_).NumRefShapeFunctions(2) ==
                   (*rfs_quad_p_).NumRefShapeFunctions(2)),
                  "#RSF mismatch on nodes "
                      << (*rfs_tria_p_).NumRefShapeFunctions(2) << " <-> "
                      << (*rfs_quad_p_).NumRefShapeFunctions(2));
    LF_ASSERT_MSG(((*rfs_tria_p_).NumRefShapeFunctions(1) ==
                   (*rfs_quad_p_).NumRefShapeFunctions(1)),
                  "#RSF mismatch on edges "
                      << (*rfs_tria_p_).NumRefShapeFunctions(1) << " <-> "
                      << (*rfs_quad_p_).NumRefShapeFunctions(1));
  }
  if ((rfs_tria_p_ != nullptr) && (rfs_edge_p_ != nullptr)) {
    LF_ASSERT_MSG(((*rfs_tria_p_).NumRefShapeFunctions(2) ==
                   (*rfs_edge_p_).NumRefShapeFunctions(1)),
                  "#RSF mismatch on nodes "
                      << (*rfs_tria_p_).NumRefShapeFunctions(2) << " <-> "
                      << (*rfs_edge_p_).NumRefShapeFunctions(1));
    LF_ASSERT_MSG(((*rfs_tria_p_).NumRefShapeFunctions(1) ==
                   (*rfs_edge_p_).NumRefShapeFunctions(0)),
                  "#RSF mismatch on edges "
                      << (*rfs_tria_p_).NumRefShapeFunctions(1) << " <-> "
                      << (*rfs_edge_p_).NumRefShapeFunctions(0));
  }
  if ((rfs_quad_p_ != nullptr) && (rfs_edge_p_ != nullptr)) {
    LF_ASSERT_MSG(((*rfs_quad_p_).NumRefShapeFunctions(2) ==
                   (*rfs_edge_p_).NumRefShapeFunctions(1)),
                  "#RSF mismatch on edges "
                      << (*rfs_quad_p_).NumRefShapeFunctions(2) << " <-> "
                      << (*rfs_edge_p_).NumRefShapeFunctions(1));
    LF_ASSERT_MSG(((*rfs_quad_p_).NumRefShapeFunctions(1) ==
                   (*rfs_edge_p_).NumRefShapeFunctions(0)),
                  "#RSF mismatch on edges "
                      << (*rfs_quad_p_).NumRefShapeFunctions(1) << " <-> "
                      << (*rfs_edge_p_).NumRefShapeFunctions(0));
  }

  // Initialization of dof handler starting with collecting the number of
  // interior reference shape functions
  const lf::assemble::UniformFEDofHandler::dof_map_t rsf_layout{
      {lf::base::RefEl::kPoint(), num_rsf_node_},
      {lf::base::RefEl::kSegment(), num_rsf_edge_},
      {lf::base::RefEl::kTria(), num_rsf_tria_},
      {lf::base::RefEl::kQuad(), num_rsf_quad_}};

  // NOLINTNEXTLINE(modernize-return-braced-init-list)
  return lf::assemble::UniformFEDofHandler(std::move(mesh_p), rsf_layout);
}